

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong __thiscall mkvparser::Cluster::GetTime(Cluster *this)

{
  long lVar1;
  long len;
  longlong pos;
  long lStack_18;
  longlong local_10;
  
  lVar1 = Load(this,&local_10,&lStack_18);
  if (-1 < lVar1) {
    lVar1 = this->m_timecode;
  }
  if (-1 < lVar1) {
    lVar1 = this->m_timecode * this->m_pSegment->m_pInfo->m_timecodeScale;
  }
  return lVar1;
}

Assistant:

long long Cluster::GetTime() const {
  const long long tc = GetTimeCode();

  if (tc < 0)
    return tc;

  const SegmentInfo* const pInfo = m_pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long t = m_timecode * scale;

  return t;
}